

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  int iVar1;
  string *psVar2;
  string *psVar3;
  pointer __nptr;
  string *var;
  ulong uVar4;
  
  psVar2 = GetDef(this,&nMatchesVariable_abi_cxx11_);
  if (psVar2 == (string *)0x0) {
    __nptr = (char *)0x0;
  }
  else {
    __nptr = (psVar2->_M_dataplus)._M_p;
  }
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    if (-1 < iVar1) {
      uVar4 = (ulong)(iVar1 + 1);
      psVar2 = matchVariables_abi_cxx11_;
      do {
        psVar3 = GetSafeDefinition(this,psVar2);
        if (psVar3->_M_string_length != 0) {
          AddDefinition(this,psVar2,"");
          cmStateSnapshot::GetDefinition(&this->StateSnapshot,psVar2);
        }
        psVar2 = psVar2 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,"0");
    cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
    return;
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  const char* nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr) {
    return;
  }
  int nMatches = atoi(nMatchesStr);
  for (int i = 0; i <= nMatches; i++) {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if (!s.empty()) {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
    }
  }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}